

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

size_t google::protobuf::internal::WireFormatLite::SInt64Size(RepeatedField<long> *value)

{
  long lVar1;
  int iVar2;
  const_reference plVar3;
  ulong uVar4;
  int index;
  size_t sVar5;
  
  iVar2 = SooRep::size(&value->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(value->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
  index = 0;
  if (iVar2 < 1) {
    sVar5 = 0;
  }
  else {
    sVar5 = 0;
    do {
      plVar3 = RepeatedField<long>::Get(value,index);
      uVar4 = *plVar3 >> 0x3f ^ *plVar3 * 2 | 1;
      lVar1 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar1 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (iVar2 != index);
  }
  return sVar5;
}

Assistant:

size_t WireFormatLite::SInt64Size(const RepeatedField<int64_t>& value) {
  size_t out = 0;
  const int n = value.size();
  for (int i = 0; i < n; i++) {
    out += SInt64Size(value.Get(i));
  }
  return out;
}